

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateDebugInfoOperand
          (ValidationState_t *_,string *debug_inst_name,
          CommonDebugInfoInstructions expected_debug_inst,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  spv_result_t sVar2;
  DiagnosticStream *pDVar3;
  spv_ext_inst_desc desc;
  function<bool_(CommonDebugInfoInstructions)> expectation;
  spv_ext_inst_desc local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  DiagnosticStream local_208;
  
  local_228._8_8_ = 0;
  local_228._4_4_ = 0;
  local_228._0_4_ = expected_debug_inst;
  pcStack_210 = std::
                _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_extensions.cpp:186:7)>
                ::_M_invoke;
  local_218 = std::
              _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_extensions.cpp:186:7)>
              ::_M_manager;
  bVar1 = DoesDebugInfoOperandMatchExpectation
                    (_,(function<bool_(CommonDebugInfoInstructions)> *)&local_228,inst,word_index);
  sVar2 = SPV_SUCCESS;
  if (!bVar1) {
    local_250 = (spv_ext_inst_desc)0x0;
    sVar2 = AssemblyGrammar::lookupExtInst
                      (&_->grammar_,(inst->inst_).ext_inst_type,expected_debug_inst,&local_250);
    if ((sVar2 == SPV_SUCCESS) && (local_250 != (spv_ext_inst_desc)0x0)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00642d36:
        std::__throw_bad_function_call();
      }
      (*ext_inst_name->_M_invoker)(&local_248,(_Any_data *)ext_inst_name);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"expected operand ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,(debug_inst_name->_M_dataplus)._M_p,
                 debug_inst_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," must be a result id of ",0x18);
      pDVar3 = DiagnosticStream::operator<<(&local_208,&local_250->name);
      sVar2 = pDVar3->error_;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00642d36;
      (*ext_inst_name->_M_invoker)(&local_248,(_Any_data *)ext_inst_name);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_248._M_dataplus._M_p,local_248._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"expected operand ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,(debug_inst_name->_M_dataplus)._M_p,
                 debug_inst_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," is invalid",0xb);
      sVar2 = local_208.error_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateDebugInfoOperand(
    ValidationState_t& _, const std::string& debug_inst_name,
    CommonDebugInfoInstructions expected_debug_inst, const Instruction* inst,
    uint32_t word_index, const std::function<std::string()>& ext_inst_name) {
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [expected_debug_inst](CommonDebugInfoInstructions dbg_inst) {
        return dbg_inst == expected_debug_inst;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  spv_ext_inst_desc desc = nullptr;
  if (_.grammar().lookupExtInst(inst->ext_inst_type(), expected_debug_inst,
                                &desc) != SPV_SUCCESS ||
      !desc) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": "
           << "expected operand " << debug_inst_name << " is invalid";
  }
  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name << " must be a result id of "
         << desc->name;
}